

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

bool __thiscall ON_Buffer::Compress(ON_Buffer *this,ON_Buffer *compressed_buffer)

{
  ON_BUFFER_SEGMENT **ppOVar1;
  ulong uVar2;
  ulong uVar3;
  ON_Buffer_ErrorHandler p_Var4;
  bool bVar5;
  ON__UINT32 OVar6;
  ON__UINT32 OVar7;
  ON_Buffer *this_00;
  ON_BUFFER_SEGMENT *pOVar8;
  ON__UINT64 OVar9;
  ON_BUFFER_SEGMENT *pOVar10;
  bool bVar11;
  ulong uVar12;
  ON_CompressStream compressor;
  ON_CompressStream local_70;
  
  ON_CompressStream::ON_CompressStream(&local_70);
  this_00 = compressed_buffer;
  if (this == compressed_buffer) {
    this_00 = (ON_Buffer *)operator_new(0x40);
    ON_Buffer(this_00);
  }
  ChangeSize(this_00,0);
  uVar2 = this->m_buffer_size;
  if (((uVar2 == 0) ||
      (bVar5 = ON_CompressStream::SetCallback(&local_70,ON_Buffer_StreamCallback,this_00), !bVar5))
     || (bVar5 = ON_CompressStream::Begin(&local_70), !bVar5)) {
LAB_0045b4be:
    ChangeSize(this_00,0);
    bVar11 = false;
    bVar5 = false;
    if (this != compressed_buffer) goto LAB_0045b4e4;
  }
  else {
    if (this->m_first_segment != (ON_BUFFER_SEGMENT *)0x0) {
      pOVar8 = (ON_BUFFER_SEGMENT *)0x0;
      pOVar10 = this->m_first_segment;
      do {
        uVar3 = pOVar10->m_segment_position0;
        uVar12 = pOVar10->m_segment_position1;
        if (uVar2 < pOVar10->m_segment_position1) {
          uVar12 = uVar2;
        }
        if ((uVar12 < uVar3) || (pOVar8 != pOVar10->m_prev_segment)) goto LAB_0045b4be;
        if (pOVar8 == (ON_BUFFER_SEGMENT *)0x0) {
          if (uVar3 != 0) goto LAB_0045b4be;
        }
        else if (pOVar8->m_segment_position1 != uVar3) goto LAB_0045b4be;
        bVar5 = ON_CompressStream::In(&local_70,uVar12 - uVar3,pOVar10->m_segment_buffer);
        if (!bVar5) goto LAB_0045b4be;
        ppOVar1 = &pOVar10->m_next_segment;
        pOVar8 = pOVar10;
        pOVar10 = *ppOVar1;
      } while (*ppOVar1 != (ON_BUFFER_SEGMENT *)0x0);
    }
    bVar5 = ON_CompressStream::End(&local_70);
    if ((!bVar5) || (OVar9 = ON_CompressStream::InSize(&local_70), OVar9 != uVar2))
    goto LAB_0045b4be;
    OVar6 = ON_CompressStream::InCRC(&local_70);
    OVar7 = CRC32(this,0);
    if ((OVar6 != OVar7) ||
       (OVar9 = ON_CompressStream::OutSize(&local_70), OVar9 != this_00->m_buffer_size))
    goto LAB_0045b4be;
    OVar6 = ON_CompressStream::OutCRC(&local_70);
    OVar7 = CRC32(this_00,0);
    if (OVar6 != OVar7) goto LAB_0045b4be;
    Compact(this_00);
    this_00->m_current_position = 0;
    this_00->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    bVar11 = true;
    if (this != compressed_buffer) goto LAB_0045b4e4;
    ChangeSize(compressed_buffer,0);
    OVar9 = this_00->m_current_position;
    compressed_buffer->m_buffer_size = this_00->m_buffer_size;
    compressed_buffer->m_current_position = OVar9;
    pOVar8 = this_00->m_last_segment;
    compressed_buffer->m_first_segment = this_00->m_first_segment;
    compressed_buffer->m_last_segment = pOVar8;
    p_Var4 = this_00->m_error_handler;
    compressed_buffer->m_current_segment = this_00->m_current_segment;
    compressed_buffer->m_error_handler = p_Var4;
    compressed_buffer->m_last_error = this_00->m_last_error;
    this_00->m_buffer_size = 0;
    this_00->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    this_00->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
    this_00->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    bVar5 = true;
  }
  bVar11 = bVar5;
  ~ON_Buffer(this_00);
  operator_delete(this_00,0x40);
LAB_0045b4e4:
  ON_CompressStream::~ON_CompressStream(&local_70);
  return bVar11;
}

Assistant:

bool ON_Buffer::Compress( ON_Buffer& compressed_buffer ) const
{
  bool rc = false;
  ON_CompressStream compressor;
  ON_Buffer* out = ( this == &compressed_buffer ) ? new ON_Buffer() : &compressed_buffer;

  out->Destroy();

  for (;;)
  {
    ON__UINT64 uncompressed_size = Size();
    if ( uncompressed_size <= 0 )
      break;
    if ( !compressor.SetCallback(ON_Buffer_StreamCallback,out) )
      break;
    if ( !compressor.Begin() )
      break;

    struct ON_BUFFER_SEGMENT* prev_seg = 0;
    struct ON_BUFFER_SEGMENT* seg = 0;
    for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
    {
      const ON__UINT64 pos1 = (uncompressed_size < seg->m_segment_position1)
                            ? uncompressed_size 
                            : seg->m_segment_position1;
      if ( pos1 < seg->m_segment_position0 )
        break;
      if ( prev_seg != seg->m_prev_segment )
        break;
      if ( 0 == prev_seg )
      {
        if ( 0 != seg->m_segment_position0 )
          break;
      }
      else
      {
        if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
          break;
      }
      if ( !compressor.In(pos1 - seg->m_segment_position0,seg->m_segment_buffer) )
        break;
      prev_seg = seg;
    }
    if ( 0 != seg )
      break;

    if ( !compressor.End() )
      break;

    if ( compressor.InSize() != uncompressed_size )
      break;
    if ( compressor.InCRC() != CRC32(0) )
      break;
    if ( compressor.OutSize() != out->Size() )
      break;
    if ( compressor.OutCRC() != out->CRC32(0) )
      break;

    rc = true;
    break;
  }

  if ( !rc )
  {
    out->Destroy();
    if ( this == &compressed_buffer )
      delete out;
  }
  else
  {
    out->Compact();
    out->m_current_position = 0;
    out->m_current_segment = 0;
    if ( this == &compressed_buffer )
    {
      // transfer "out" to "this"
      compressed_buffer.Destroy();
      compressed_buffer.m_buffer_size = out->m_buffer_size;
      compressed_buffer.m_current_position = out->m_current_position;
      compressed_buffer.m_first_segment = out->m_first_segment;
      compressed_buffer.m_last_segment = out->m_last_segment;
      compressed_buffer.m_current_segment = out->m_current_segment;
      compressed_buffer.m_error_handler = out->m_error_handler;
      compressed_buffer.m_last_error = out->m_last_error;
      
      out->m_first_segment = 0;
      out->m_last_segment = 0;
      out->m_current_segment = 0;
      out->m_buffer_size = 0;
      delete out;
    }
  }

  return rc;
}